

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

string * __thiscall
kratos::Generator::get_unique_variable_name
          (string *__return_storage_ptr__,Generator *this,string *prefix,string *var_name)

{
  undefined8 uVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_a8 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Generator *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  uint local_3c;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_50 = this;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
  if ((pointer)prefix->_M_string_length == (pointer)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    local_a8._0_8_ = (prefix->_M_dataplus)._M_p;
    local_a8._16_8_ = (var_name->_M_dataplus)._M_p;
    local_a8._24_8_ = var_name->_M_string_length;
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x7;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8;
    local_a8._8_8_ = (pointer)prefix->_M_string_length;
    fmt::v7::detail::vformat_abi_cxx11_((string *)&local_70,(detail *)"{0}_{1}",format_str,args);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)local_70._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_allocated_capacity != &local_60) {
      operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1);
    }
  }
  get_var((Generator *)local_a8,(string *)local_50);
  uVar1 = local_a8._0_8_;
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  if ((_func_int **)uVar1 != (_func_int **)0x0) {
    local_3c = 0;
    do {
      this_00._M_pi = local_38._M_pi;
      local_a8._8_8_ = prefix->_M_string_length;
      local_a8._16_8_ = ZEXT48(local_3c);
      if ((pointer)local_a8._8_8_ == (pointer)0x0) {
        local_a8._0_8_ = (var_name->_M_dataplus)._M_p;
        local_a8._8_8_ = var_name->_M_string_length;
        format_str_01.size_ = 0x2d;
        format_str_01.data_ = (char *)0x7;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_a8;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)&local_70,(detail *)"{0}_{1}",format_str_01,args_01);
      }
      else {
        local_a8._0_8_ = (prefix->_M_dataplus)._M_p;
        local_a8._24_8_ = var_name->_M_string_length;
        format_str_00.size_ = 0x2dd;
        format_str_00.data_ = (char *)0xb;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_a8;
        local_a8._32_8_ = local_a8._16_8_;
        local_a8._16_8_ = (pointer)(var_name->_M_dataplus)._M_p;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)&local_70,(detail *)"{0}_{1}_{2}",format_str_00,args_00);
      }
      std::__cxx11::string::operator=((string *)this_00._M_pi,(string *)local_70._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_allocated_capacity != &local_60) {
        operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1);
      }
      get_var((Generator *)local_a8,(string *)local_50);
      uVar1 = local_a8._0_8_;
      if ((pointer)local_a8._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      local_3c = local_3c + 1;
    } while ((_func_int **)uVar1 != (_func_int **)0x0);
  }
  return (string *)local_38._M_pi;
}

Assistant:

std::string Generator::get_unique_variable_name(const std::string &prefix,
                                                const std::string &var_name) {
    // NOTE: this is not thread-safe!
    uint32_t count = 0;
    std::string result_name;
    // maybe we're lucky and not need to prefix the count
    if (prefix.empty()) {
        result_name = var_name;
    } else {
        result_name = ::format("{0}_{1}", prefix, var_name);
    }
    if (!get_var(result_name)) return result_name;

    while (true) {
        if (prefix.empty()) {
            result_name = ::format("{0}_{1}", var_name, count);
        } else {
            result_name = ::format("{0}_{1}_{2}", prefix, var_name, count);
        }
        if (!get_var(result_name)) {
            break;
        } else {
            count++;
        }
    }
    return result_name;
}